

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O0

qsizetype QtPrivate::lastIndexOf(QByteArrayView haystack,qsizetype from,char needle)

{
  long lVar1;
  QByteArrayView haystack_00;
  qsizetype qVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  undefined7 in_stack_00000010;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  haystack_00.m_size._7_1_ = needle;
  haystack_00.m_size._0_7_ = in_stack_00000010;
  haystack_00.m_data = (storage_type *)from;
  qVar2 = lastIndexOf(haystack_00,in_stack_00000008,(uchar)((ulong)in_RDI >> 0x38));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return qVar2;
  }
  __stack_chk_fail();
}

Assistant:

Q_CORE_EXPORT qsizetype lastIndexOf(QByteArrayView haystack, qsizetype from, char needle) noexcept
{
    return lastIndexOf(haystack, from, uchar(needle));
}